

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav__on_seek_memory_write(void *pUserData,int offset,drwav_seek_origin origin)

{
  drwav *pWav;
  drwav_seek_origin origin_local;
  int offset_local;
  void *pUserData_local;
  
  if (origin == drwav_seek_origin_current) {
    offset_local = offset;
    if (offset < 1) {
      if (*(ulong *)((long)pUserData + 0x118) < (ulong)(long)-offset) {
        offset_local = -(int)*(undefined8 *)((long)pUserData + 0x118);
      }
    }
    else if (*(ulong *)((long)pUserData + 0x108) <
             (ulong)(*(long *)((long)pUserData + 0x118) + (long)offset)) {
      offset_local = (int)*(undefined8 *)((long)pUserData + 0x108) -
                     (int)*(undefined8 *)((long)pUserData + 0x118);
    }
    *(long *)((long)pUserData + 0x118) = (long)offset_local + *(long *)((long)pUserData + 0x118);
  }
  else if (*(ulong *)((long)pUserData + 0x108) < (ulong)(uint)offset) {
    *(undefined8 *)((long)pUserData + 0x118) = *(undefined8 *)((long)pUserData + 0x108);
  }
  else {
    *(long *)((long)pUserData + 0x118) = (long)offset;
  }
  return 1;
}

Assistant:

static drwav_bool32 drwav__on_seek_memory_write(void* pUserData, int offset, drwav_seek_origin origin)
{
    drwav* pWav = (drwav*)pUserData;
    DRWAV_ASSERT(pWav != NULL);

    if (origin == drwav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStreamWrite.currentWritePos + offset > pWav->memoryStreamWrite.dataSize) {
                offset = (int)(pWav->memoryStreamWrite.dataSize - pWav->memoryStreamWrite.currentWritePos);  /* Trying to seek too far forward. */
            }
        } else {
            if (pWav->memoryStreamWrite.currentWritePos < (size_t)-offset) {
                offset = -(int)pWav->memoryStreamWrite.currentWritePos;  /* Trying to seek too far backwards. */
            }
        }

        /* This will never underflow thanks to the clamps above. */
        pWav->memoryStreamWrite.currentWritePos += offset;
    } else {
        if ((drwav_uint32)offset <= pWav->memoryStreamWrite.dataSize) {
            pWav->memoryStreamWrite.currentWritePos = offset;
        } else {
            pWav->memoryStreamWrite.currentWritePos = pWav->memoryStreamWrite.dataSize;  /* Trying to seek too far forward. */
        }
    }
    
    return DRWAV_TRUE;
}